

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SievingPrimes.cpp
# Opt level: O2

void __thiscall
primesieve::SievingPrimes::SievingPrimes
          (SievingPrimes *this,Erat *erat,uint64_t sieveSize,MemoryPool *memoryPool)

{
  Erat::Erat(&this->super_Erat);
  this->low_ = 0;
  this->tinyIdx_ = 0;
  this->i_ = 0;
  this->size_ = 0;
  this->sieveIdx_ = 0xffffffffffffffff;
  (this->tinySieve_).array_ = (bool *)0x0;
  (this->tinySieve_).end_ = (bool *)0x0;
  (this->tinySieve_).capacity_ = (bool *)0x0;
  init(this,(EVP_PKEY_CTX *)erat);
  return;
}

Assistant:

SievingPrimes::SievingPrimes(Erat* erat,
                             uint64_t sieveSize,
                             MemoryPool& memoryPool)
{
  init(erat, sieveSize, memoryPool);
}